

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BEREncode.cpp
# Opt level: O3

int __thiscall OpaqueType::serialise(OpaqueType *this,uint8_t *buf,size_t max_len)

{
  uint uVar1;
  uint8_t *puVar2;
  uint8_t uVar3;
  int iVar4;
  long lVar5;
  
  iVar4 = -0x1f;
  if (1 < max_len) {
    uVar1 = this->_dataLength;
    *buf = (char)(this->super_BER_CONTAINER)._type;
    lVar5 = 2;
    puVar2 = buf + 1;
    if (0x7f < uVar1) {
      if (uVar1 < 0x101) {
        puVar2 = buf + 2;
        lVar5 = 3;
        uVar3 = 0x81;
      }
      else {
        puVar2 = buf + 3;
        buf[2] = (uint8_t)(uVar1 >> 8);
        lVar5 = 4;
        uVar3 = 0x82;
      }
      buf[1] = uVar3;
    }
    *puVar2 = (uint8_t)uVar1;
    if ((ulong)((int)uVar1 + lVar5) <= max_len) {
      memcpy(buf + lVar5,this->_value,(long)this->_dataLength);
      iVar4 = ((int)(buf + lVar5) + this->_dataLength) - (int)buf;
    }
  }
  return iVar4;
}

Assistant:

int OpaqueType::serialise(uint8_t* buf, size_t max_len){
    int i = BER_CONTAINER::serialise(buf, max_len, _dataLength);
    CHECK_ENCODE_ERR(i);
    uint8_t *ptr = buf + i;

    memcpy(ptr, _value, _dataLength);
    ptr += _dataLength;

    return ptr - buf;
}